

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rawtransaction.cpp
# Opt level: O0

RPCHelpMan * analyzepsbt(void)

{
  initializer_list<RPCArg> __l;
  initializer_list<RPCResult> __l_00;
  initializer_list<RPCResult> __l_01;
  initializer_list<RPCResult> __l_02;
  initializer_list<RPCResult> __l_03;
  initializer_list<RPCResult> __l_04;
  initializer_list<RPCResult> __l_05;
  RPCHelpMan *in_RDI;
  undefined1 *puVar1;
  long in_FS_OFFSET;
  allocator<RPCResult> *in_stack_ffffffffffffe758;
  uint uVar4;
  allocator<RPCResult> *paVar2;
  vector<RPCResult,_std::allocator<RPCResult>_> *pvVar3;
  RPCArg *this;
  anon_class_1_0_00000001 *in_stack_ffffffffffffe760;
  function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)> *in_stack_ffffffffffffe768;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffe770;
  string *in_stack_ffffffffffffe788;
  string *in_stack_ffffffffffffe790;
  allocator<char> *in_stack_ffffffffffffe798;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffe7a0;
  undefined7 in_stack_ffffffffffffe7a8;
  undefined1 in_stack_ffffffffffffe7af;
  string *in_stack_ffffffffffffe7b0;
  undefined7 in_stack_ffffffffffffe7b8;
  undefined1 in_stack_ffffffffffffe7bf;
  undefined4 in_stack_ffffffffffffe7c0;
  Type in_stack_ffffffffffffe7c4;
  string *in_stack_ffffffffffffe7c8;
  undefined4 in_stack_ffffffffffffe7d0;
  Type in_stack_ffffffffffffe7d4;
  undefined4 in_stack_ffffffffffffe7d8;
  Type in_stack_ffffffffffffe7dc;
  RPCResult *in_stack_ffffffffffffe7e0;
  undefined1 *local_1768;
  RPCExamples *in_stack_ffffffffffffe8a0;
  RPCResults *in_stack_ffffffffffffe8a8;
  undefined1 *puVar5;
  vector<RPCArg,_std::allocator<RPCArg>_> *in_stack_ffffffffffffe8b0;
  string *in_stack_ffffffffffffe8b8;
  string *in_stack_ffffffffffffe8c0;
  RPCHelpMan *in_stack_ffffffffffffe8c8;
  undefined1 *local_1720;
  undefined1 *local_1708;
  undefined1 *local_16f0;
  undefined1 *local_16d8;
  RPCMethodImpl *fun;
  undefined1 local_13a0 [38];
  allocator<char> local_137a [2];
  pointer local_1378;
  pointer pRStack_1370;
  pointer local_1368;
  allocator<char> local_135a;
  allocator<char> local_1359 [31];
  allocator<char> local_133a;
  allocator<char> local_1339 [31];
  allocator<char> local_131a;
  allocator<char> local_1319 [17];
  undefined8 local_1308;
  undefined1 local_12f9 [30];
  allocator<char> local_12db [3];
  _Alloc_hider local_12d8;
  size_type sStack_12d0;
  undefined1 local_12c8 [14];
  allocator<char> local_12ba [2];
  pointer local_12b8;
  pointer pbStack_12b0;
  pointer local_12a8;
  allocator<char> local_129a;
  allocator<char> local_1299;
  undefined8 local_1298;
  undefined8 uStack_1290;
  undefined8 local_1288;
  allocator<char> local_127b;
  allocator<char> local_127a [2];
  undefined8 local_1278;
  undefined8 uStack_1270;
  undefined8 local_1268;
  allocator<char> local_125a;
  allocator<char> local_1259 [30];
  allocator<char> local_123b;
  allocator<char> local_123a [2];
  undefined8 local_1238;
  undefined8 uStack_1230;
  undefined8 local_1228;
  allocator<char> local_121a;
  allocator<char> local_1219 [31];
  allocator<char> local_11fa;
  allocator<char> local_11f9 [31];
  allocator<char> local_11da;
  allocator<char> local_11d9;
  undefined8 local_11d8;
  undefined8 uStack_11d0;
  undefined8 local_11c8;
  allocator<char> local_11ba;
  allocator<char> local_11b9;
  undefined8 local_11b8;
  undefined8 uStack_11b0;
  undefined8 local_11a8;
  allocator<char> local_1192;
  allocator<char> local_1191 [31];
  allocator<char> local_1172;
  allocator<char> local_1171 [31];
  allocator<char> local_1152;
  allocator<char> local_1151 [31];
  allocator<char> local_1132;
  allocator<char> local_1131 [32];
  allocator<char> local_1111;
  undefined4 local_1110;
  allocator<char> local_1109 [31];
  allocator<char> local_10ea;
  allocator<char> local_10e9 [233];
  undefined8 local_1000;
  undefined1 local_e08 [136];
  undefined1 local_d80 [128];
  undefined1 local_d00 [136];
  undefined1 local_c78 [64];
  undefined1 local_c38 [544];
  undefined1 local_a18 [192];
  undefined1 local_958 [544];
  undefined1 local_738 [64];
  undefined1 local_6f8 [136];
  undefined1 local_670 [64];
  undefined1 local_630 [816];
  undefined1 local_300 [200];
  undefined1 local_238;
  undefined8 local_210;
  undefined8 uStack_208;
  undefined8 local_200;
  undefined1 local_1f8;
  undefined1 local_1f7;
  undefined1 local_150 [264];
  undefined1 local_48 [64];
  long local_8;
  
  local_1000 = 0;
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe7af,in_stack_ffffffffffffe7a8),
             (char *)in_stack_ffffffffffffe7a0,in_stack_ffffffffffffe798);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe7af,in_stack_ffffffffffffe7a8),
             (char *)in_stack_ffffffffffffe7a0,in_stack_ffffffffffffe798);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe7af,in_stack_ffffffffffffe7a8),
             (char *)in_stack_ffffffffffffe7a0,in_stack_ffffffffffffe798);
  local_1110 = 0;
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<RPCArg::Optional,void,void,RPCArg::Optional,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffe768,(Optional *)in_stack_ffffffffffffe760);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe7af,in_stack_ffffffffffffe7a8),
             (char *)in_stack_ffffffffffffe7a0,in_stack_ffffffffffffe798);
  local_238 = 0;
  std::__cxx11::string::string(in_stack_ffffffffffffe770);
  local_210 = 0;
  uStack_208 = 0;
  local_200 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_ffffffffffffe758);
  local_1f8 = 0;
  local_1f7 = 0;
  RPCArg::RPCArg((RPCArg *)CONCAT44(in_stack_ffffffffffffe7d4,in_stack_ffffffffffffe7d0),
                 in_stack_ffffffffffffe7c8,in_stack_ffffffffffffe7c4,
                 (Fallback *)CONCAT17(in_stack_ffffffffffffe7bf,in_stack_ffffffffffffe7b8),
                 in_stack_ffffffffffffe7b0,
                 (RPCArgOptions *)CONCAT17(in_stack_ffffffffffffe7af,in_stack_ffffffffffffe7a8));
  std::allocator<RPCArg>::allocator((allocator<RPCArg> *)in_stack_ffffffffffffe758);
  __l._M_len._0_7_ = in_stack_ffffffffffffe7a8;
  __l._M_array = (iterator)in_stack_ffffffffffffe7a0;
  __l._M_len._7_1_ = in_stack_ffffffffffffe7af;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_ffffffffffffe798,__l,
             (allocator_type *)in_stack_ffffffffffffe790);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe7af,in_stack_ffffffffffffe7a8),
             (char *)in_stack_ffffffffffffe7a0,in_stack_ffffffffffffe798);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe7af,in_stack_ffffffffffffe7a8),
             (char *)in_stack_ffffffffffffe7a0,in_stack_ffffffffffffe798);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe7af,in_stack_ffffffffffffe7a8),
             (char *)in_stack_ffffffffffffe7a0,in_stack_ffffffffffffe798);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe7af,in_stack_ffffffffffffe7a8),
             (char *)in_stack_ffffffffffffe7a0,in_stack_ffffffffffffe798);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe7af,in_stack_ffffffffffffe7a8),
             (char *)in_stack_ffffffffffffe7a0,in_stack_ffffffffffffe798);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe7af,in_stack_ffffffffffffe7a8),
             (char *)in_stack_ffffffffffffe7a0,in_stack_ffffffffffffe798);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe7af,in_stack_ffffffffffffe7a8),
             (char *)in_stack_ffffffffffffe7a0,in_stack_ffffffffffffe798);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe7af,in_stack_ffffffffffffe7a8),
             (char *)in_stack_ffffffffffffe7a0,in_stack_ffffffffffffe798);
  local_11b8 = 0;
  uStack_11b0 = 0;
  local_11a8 = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe758);
  RPCResult::RPCResult
            (in_stack_ffffffffffffe7e0,in_stack_ffffffffffffe7dc,
             (string *)CONCAT44(in_stack_ffffffffffffe7d4,in_stack_ffffffffffffe7d0),
             in_stack_ffffffffffffe7c8,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffe7c4,in_stack_ffffffffffffe7c0),
             (bool)in_stack_ffffffffffffe7bf);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe7af,in_stack_ffffffffffffe7a8),
             (char *)in_stack_ffffffffffffe7a0,in_stack_ffffffffffffe798);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe7af,in_stack_ffffffffffffe7a8),
             (char *)in_stack_ffffffffffffe7a0,in_stack_ffffffffffffe798);
  local_11d8 = 0;
  uStack_11d0 = 0;
  local_11c8 = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe758);
  RPCResult::RPCResult
            (in_stack_ffffffffffffe7e0,in_stack_ffffffffffffe7dc,
             (string *)CONCAT44(in_stack_ffffffffffffe7d4,in_stack_ffffffffffffe7d0),
             in_stack_ffffffffffffe7c8,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffe7c4,in_stack_ffffffffffffe7c0),
             (bool)in_stack_ffffffffffffe7bf);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe7af,in_stack_ffffffffffffe7a8),
             (char *)in_stack_ffffffffffffe7a0,in_stack_ffffffffffffe798);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe7af,in_stack_ffffffffffffe7a8),
             (char *)in_stack_ffffffffffffe7a0,in_stack_ffffffffffffe798);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe7af,in_stack_ffffffffffffe7a8),
             (char *)in_stack_ffffffffffffe7a0,in_stack_ffffffffffffe798);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe7af,in_stack_ffffffffffffe7a8),
             (char *)in_stack_ffffffffffffe7a0,in_stack_ffffffffffffe798);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe7af,in_stack_ffffffffffffe7a8),
             (char *)in_stack_ffffffffffffe7a0,in_stack_ffffffffffffe798);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe7af,in_stack_ffffffffffffe7a8),
             (char *)in_stack_ffffffffffffe7a0,in_stack_ffffffffffffe798);
  local_1238 = 0;
  uStack_1230 = 0;
  local_1228 = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe758);
  RPCResult::RPCResult
            (in_stack_ffffffffffffe7e0,in_stack_ffffffffffffe7dc,
             (string *)CONCAT44(in_stack_ffffffffffffe7d4,in_stack_ffffffffffffe7d0),
             in_stack_ffffffffffffe7c8,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffe7c4,in_stack_ffffffffffffe7c0),
             (bool)in_stack_ffffffffffffe7bf);
  std::allocator<RPCResult>::allocator(in_stack_ffffffffffffe758);
  uVar4 = (uint)((ulong)in_stack_ffffffffffffe758 >> 0x20);
  __l_00._M_len._0_7_ = in_stack_ffffffffffffe7a8;
  __l_00._M_array = (iterator)in_stack_ffffffffffffe7a0;
  __l_00._M_len._7_1_ = in_stack_ffffffffffffe7af;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe798,__l_00,
             (allocator_type *)in_stack_ffffffffffffe790);
  paVar2 = (allocator<RPCResult> *)((ulong)uVar4 << 0x20);
  RPCResult::RPCResult
            ((RPCResult *)CONCAT44(in_stack_ffffffffffffe7dc,in_stack_ffffffffffffe7d8),
             in_stack_ffffffffffffe7d4,in_stack_ffffffffffffe7c8,
             SUB41(in_stack_ffffffffffffe7c4 >> 0x18,0),
             (string *)CONCAT17(in_stack_ffffffffffffe7bf,in_stack_ffffffffffffe7b8),
             (vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe7b0,
             (bool)in_stack_ffffffffffffe7af);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe7af,in_stack_ffffffffffffe7a8),
             (char *)in_stack_ffffffffffffe7a0,in_stack_ffffffffffffe798);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe7af,in_stack_ffffffffffffe7a8),
             (char *)in_stack_ffffffffffffe7a0,in_stack_ffffffffffffe798);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe7af,in_stack_ffffffffffffe7a8),
             (char *)in_stack_ffffffffffffe7a0,in_stack_ffffffffffffe798);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe7af,in_stack_ffffffffffffe7a8),
             (char *)in_stack_ffffffffffffe7a0,in_stack_ffffffffffffe798);
  local_1278 = 0;
  uStack_1270 = 0;
  local_1268 = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)paVar2);
  RPCResult::RPCResult
            (in_stack_ffffffffffffe7e0,in_stack_ffffffffffffe7dc,
             (string *)CONCAT44(in_stack_ffffffffffffe7d4,in_stack_ffffffffffffe7d0),
             in_stack_ffffffffffffe7c8,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffe7c4,in_stack_ffffffffffffe7c0),
             (bool)in_stack_ffffffffffffe7bf);
  std::allocator<RPCResult>::allocator(paVar2);
  __l_01._M_len._0_7_ = in_stack_ffffffffffffe7a8;
  __l_01._M_array = (iterator)in_stack_ffffffffffffe7a0;
  __l_01._M_len._7_1_ = in_stack_ffffffffffffe7af;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe798,__l_01,
             (allocator_type *)in_stack_ffffffffffffe790);
  pvVar3 = (vector<RPCResult,_std::allocator<RPCResult>_> *)((ulong)paVar2 & 0xffffffff00000000);
  RPCResult::RPCResult
            ((RPCResult *)CONCAT44(in_stack_ffffffffffffe7dc,in_stack_ffffffffffffe7d8),
             in_stack_ffffffffffffe7d4,in_stack_ffffffffffffe7c8,
             SUB41(in_stack_ffffffffffffe7c4 >> 0x18,0),
             (string *)CONCAT17(in_stack_ffffffffffffe7bf,in_stack_ffffffffffffe7b8),
             (vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe7b0,
             (bool)in_stack_ffffffffffffe7af);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe7af,in_stack_ffffffffffffe7a8),
             (char *)in_stack_ffffffffffffe7a0,in_stack_ffffffffffffe798);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe7af,in_stack_ffffffffffffe7a8),
             (char *)in_stack_ffffffffffffe7a0,in_stack_ffffffffffffe798);
  local_1298 = 0;
  uStack_1290 = 0;
  local_1288 = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector(pvVar3);
  pvVar3 = (vector<RPCResult,_std::allocator<RPCResult>_> *)((ulong)pvVar3 & 0xffffffff00000000);
  RPCResult::RPCResult
            ((RPCResult *)CONCAT44(in_stack_ffffffffffffe7dc,in_stack_ffffffffffffe7d8),
             in_stack_ffffffffffffe7d4,in_stack_ffffffffffffe7c8,
             SUB41(in_stack_ffffffffffffe7c4 >> 0x18,0),
             (string *)CONCAT17(in_stack_ffffffffffffe7bf,in_stack_ffffffffffffe7b8),
             (vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe7b0,
             (bool)in_stack_ffffffffffffe7af);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe7af,in_stack_ffffffffffffe7a8),
             (char *)in_stack_ffffffffffffe7a0,in_stack_ffffffffffffe798);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe7af,in_stack_ffffffffffffe7a8),
             (char *)in_stack_ffffffffffffe7a0,in_stack_ffffffffffffe798);
  local_12b8 = (pointer)0x0;
  pbStack_12b0 = (pointer)0x0;
  local_12a8 = (pointer)0x0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector(pvVar3);
  paVar2 = (allocator<RPCResult> *)((ulong)pvVar3 & 0xffffffff00000000);
  RPCResult::RPCResult
            ((RPCResult *)CONCAT44(in_stack_ffffffffffffe7dc,in_stack_ffffffffffffe7d8),
             in_stack_ffffffffffffe7d4,in_stack_ffffffffffffe7c8,
             SUB41(in_stack_ffffffffffffe7c4 >> 0x18,0),
             (string *)CONCAT17(in_stack_ffffffffffffe7bf,in_stack_ffffffffffffe7b8),
             (vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe7b0,
             (bool)in_stack_ffffffffffffe7af);
  std::allocator<RPCResult>::allocator(paVar2);
  __l_02._M_len._0_7_ = in_stack_ffffffffffffe7a8;
  __l_02._M_array = (iterator)in_stack_ffffffffffffe7a0;
  __l_02._M_len._7_1_ = in_stack_ffffffffffffe7af;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe798,__l_02,
             (allocator_type *)in_stack_ffffffffffffe790);
  pvVar3 = (vector<RPCResult,_std::allocator<RPCResult>_> *)((ulong)paVar2 & 0xffffffff00000000);
  RPCResult::RPCResult
            ((RPCResult *)CONCAT44(in_stack_ffffffffffffe7dc,in_stack_ffffffffffffe7d8),
             in_stack_ffffffffffffe7d4,in_stack_ffffffffffffe7c8,
             SUB41(in_stack_ffffffffffffe7c4 >> 0x18,0),
             (string *)CONCAT17(in_stack_ffffffffffffe7bf,in_stack_ffffffffffffe7b8),
             (vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe7b0,
             (bool)in_stack_ffffffffffffe7af);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe7af,in_stack_ffffffffffffe7a8),
             (char *)in_stack_ffffffffffffe7a0,in_stack_ffffffffffffe798);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe7af,in_stack_ffffffffffffe7a8),
             (char *)in_stack_ffffffffffffe7a0,in_stack_ffffffffffffe798);
  local_12d8._M_p = (pointer)0x0;
  sStack_12d0 = 0;
  local_12c8._0_8_ = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector(pvVar3);
  paVar2 = (allocator<RPCResult> *)((ulong)pvVar3 & 0xffffffff00000000);
  RPCResult::RPCResult
            ((RPCResult *)CONCAT44(in_stack_ffffffffffffe7dc,in_stack_ffffffffffffe7d8),
             in_stack_ffffffffffffe7d4,in_stack_ffffffffffffe7c8,
             SUB41(in_stack_ffffffffffffe7c4 >> 0x18,0),
             (string *)CONCAT17(in_stack_ffffffffffffe7bf,in_stack_ffffffffffffe7b8),
             (vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe7b0,
             (bool)in_stack_ffffffffffffe7af);
  std::allocator<RPCResult>::allocator(paVar2);
  __l_03._M_len._0_7_ = in_stack_ffffffffffffe7a8;
  __l_03._M_array = (iterator)in_stack_ffffffffffffe7a0;
  __l_03._M_len._7_1_ = in_stack_ffffffffffffe7af;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe798,__l_03,
             (allocator_type *)in_stack_ffffffffffffe790);
  RPCResult::RPCResult
            (in_stack_ffffffffffffe7e0,in_stack_ffffffffffffe7dc,
             (string *)CONCAT44(in_stack_ffffffffffffe7d4,in_stack_ffffffffffffe7d0),
             in_stack_ffffffffffffe7c8,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffe7c4,in_stack_ffffffffffffe7c0),
             (bool)in_stack_ffffffffffffe7bf);
  std::allocator<RPCResult>::allocator(paVar2);
  __l_04._M_len._0_7_ = in_stack_ffffffffffffe7a8;
  __l_04._M_array = (iterator)in_stack_ffffffffffffe7a0;
  __l_04._M_len._7_1_ = in_stack_ffffffffffffe7af;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe798,__l_04,
             (allocator_type *)in_stack_ffffffffffffe790);
  pvVar3 = (vector<RPCResult,_std::allocator<RPCResult>_> *)((ulong)paVar2 & 0xffffffff00000000);
  RPCResult::RPCResult
            ((RPCResult *)CONCAT44(in_stack_ffffffffffffe7dc,in_stack_ffffffffffffe7d8),
             in_stack_ffffffffffffe7d4,in_stack_ffffffffffffe7c8,
             SUB41(in_stack_ffffffffffffe7c4 >> 0x18,0),
             (string *)CONCAT17(in_stack_ffffffffffffe7bf,in_stack_ffffffffffffe7b8),
             (vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe7b0,
             (bool)in_stack_ffffffffffffe7af);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe7af,in_stack_ffffffffffffe7a8),
             (char *)in_stack_ffffffffffffe7a0,in_stack_ffffffffffffe798);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe7af,in_stack_ffffffffffffe7a8),
             (char *)in_stack_ffffffffffffe7a0,in_stack_ffffffffffffe798);
  local_12f9._1_8_ = 0;
  local_12f9._9_8_ = 0;
  local_12f9._17_8_ = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector(pvVar3);
  pvVar3 = (vector<RPCResult,_std::allocator<RPCResult>_> *)((ulong)pvVar3 & 0xffffffff00000000);
  RPCResult::RPCResult
            ((RPCResult *)CONCAT44(in_stack_ffffffffffffe7dc,in_stack_ffffffffffffe7d8),
             in_stack_ffffffffffffe7d4,in_stack_ffffffffffffe7c8,
             SUB41(in_stack_ffffffffffffe7c4 >> 0x18,0),
             (string *)CONCAT17(in_stack_ffffffffffffe7bf,in_stack_ffffffffffffe7b8),
             (vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe7b0,
             (bool)in_stack_ffffffffffffe7af);
  fun = (RPCMethodImpl *)local_12f9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe7af,in_stack_ffffffffffffe7a8),
             (char *)in_stack_ffffffffffffe7a0,in_stack_ffffffffffffe798);
  std::operator+((char *)CONCAT17(in_stack_ffffffffffffe7af,in_stack_ffffffffffffe7a8),
                 in_stack_ffffffffffffe7a0);
  std::operator+(in_stack_ffffffffffffe770,(char *)in_stack_ffffffffffffe768);
  local_1319[1] = (allocator<char>)0x0;
  local_1319[2] = (allocator<char>)0x0;
  local_1319[3] = (allocator<char>)0x0;
  local_1319[4] = (allocator<char>)0x0;
  local_1319[5] = (allocator<char>)0x0;
  local_1319[6] = (allocator<char>)0x0;
  local_1319[7] = (allocator<char>)0x0;
  local_1319[8] = (allocator<char>)0x0;
  local_1319[9] = (allocator<char>)0x0;
  local_1319[10] = (allocator<char>)0x0;
  local_1319[0xb] = (allocator<char>)0x0;
  local_1319[0xc] = (allocator<char>)0x0;
  local_1319[0xd] = (allocator<char>)0x0;
  local_1319[0xe] = (allocator<char>)0x0;
  local_1319[0xf] = (allocator<char>)0x0;
  local_1319[0x10] = (allocator<char>)0x0;
  local_1308._0_1_ = '\0';
  local_1308._1_7_ = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector(pvVar3);
  pvVar3 = (vector<RPCResult,_std::allocator<RPCResult>_> *)((ulong)pvVar3 & 0xffffffff00000000);
  RPCResult::RPCResult
            ((RPCResult *)CONCAT44(in_stack_ffffffffffffe7dc,in_stack_ffffffffffffe7d8),
             in_stack_ffffffffffffe7d4,in_stack_ffffffffffffe7c8,
             SUB41(in_stack_ffffffffffffe7c4 >> 0x18,0),
             (string *)CONCAT17(in_stack_ffffffffffffe7bf,in_stack_ffffffffffffe7b8),
             (vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe7b0,
             (bool)in_stack_ffffffffffffe7af);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe7af,in_stack_ffffffffffffe7a8),
             (char *)in_stack_ffffffffffffe7a0,in_stack_ffffffffffffe798);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe7af,in_stack_ffffffffffffe7a8),
             (char *)in_stack_ffffffffffffe7a0,in_stack_ffffffffffffe798);
  local_1339[1] = (allocator<char>)0x0;
  local_1339[2] = (allocator<char>)0x0;
  local_1339[3] = (allocator<char>)0x0;
  local_1339[4] = (allocator<char>)0x0;
  local_1339[5] = (allocator<char>)0x0;
  local_1339[6] = (allocator<char>)0x0;
  local_1339[7] = (allocator<char>)0x0;
  local_1339[8] = (allocator<char>)0x0;
  local_1339[9] = (allocator<char>)0x0;
  local_1339[10] = (allocator<char>)0x0;
  local_1339[0xb] = (allocator<char>)0x0;
  local_1339[0xc] = (allocator<char>)0x0;
  local_1339[0xd] = (allocator<char>)0x0;
  local_1339[0xe] = (allocator<char>)0x0;
  local_1339[0xf] = (allocator<char>)0x0;
  local_1339[0x10] = (allocator<char>)0x0;
  local_1339[0x11] = (allocator<char>)0x0;
  local_1339[0x12] = (allocator<char>)0x0;
  local_1339[0x13] = (allocator<char>)0x0;
  local_1339[0x14] = (allocator<char>)0x0;
  local_1339[0x15] = (allocator<char>)0x0;
  local_1339[0x16] = (allocator<char>)0x0;
  local_1339[0x17] = (allocator<char>)0x0;
  local_1339[0x18] = (allocator<char>)0x0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector(pvVar3);
  pvVar3 = (vector<RPCResult,_std::allocator<RPCResult>_> *)((ulong)pvVar3 & 0xffffffff00000000);
  RPCResult::RPCResult
            ((RPCResult *)CONCAT44(in_stack_ffffffffffffe7dc,in_stack_ffffffffffffe7d8),
             in_stack_ffffffffffffe7d4,in_stack_ffffffffffffe7c8,
             SUB41(in_stack_ffffffffffffe7c4 >> 0x18,0),
             (string *)CONCAT17(in_stack_ffffffffffffe7bf,in_stack_ffffffffffffe7b8),
             (vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe7b0,
             (bool)in_stack_ffffffffffffe7af);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe7af,in_stack_ffffffffffffe7a8),
             (char *)in_stack_ffffffffffffe7a0,in_stack_ffffffffffffe798);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe7af,in_stack_ffffffffffffe7a8),
             (char *)in_stack_ffffffffffffe7a0,in_stack_ffffffffffffe798);
  local_1359[1] = (allocator<char>)0x0;
  local_1359[2] = (allocator<char>)0x0;
  local_1359[3] = (allocator<char>)0x0;
  local_1359[4] = (allocator<char>)0x0;
  local_1359[5] = (allocator<char>)0x0;
  local_1359[6] = (allocator<char>)0x0;
  local_1359[7] = (allocator<char>)0x0;
  local_1359[8] = (allocator<char>)0x0;
  local_1359[9] = (allocator<char>)0x0;
  local_1359[10] = (allocator<char>)0x0;
  local_1359[0xb] = (allocator<char>)0x0;
  local_1359[0xc] = (allocator<char>)0x0;
  local_1359[0xd] = (allocator<char>)0x0;
  local_1359[0xe] = (allocator<char>)0x0;
  local_1359[0xf] = (allocator<char>)0x0;
  local_1359[0x10] = (allocator<char>)0x0;
  local_1359[0x11] = (allocator<char>)0x0;
  local_1359[0x12] = (allocator<char>)0x0;
  local_1359[0x13] = (allocator<char>)0x0;
  local_1359[0x14] = (allocator<char>)0x0;
  local_1359[0x15] = (allocator<char>)0x0;
  local_1359[0x16] = (allocator<char>)0x0;
  local_1359[0x17] = (allocator<char>)0x0;
  local_1359[0x18] = (allocator<char>)0x0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector(pvVar3);
  RPCResult::RPCResult
            (in_stack_ffffffffffffe7e0,in_stack_ffffffffffffe7dc,
             (string *)CONCAT44(in_stack_ffffffffffffe7d4,in_stack_ffffffffffffe7d0),
             in_stack_ffffffffffffe7c8,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffe7c4,in_stack_ffffffffffffe7c0),
             (bool)in_stack_ffffffffffffe7bf);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe7af,in_stack_ffffffffffffe7a8),
             (char *)in_stack_ffffffffffffe7a0,in_stack_ffffffffffffe798);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe7af,in_stack_ffffffffffffe7a8),
             (char *)in_stack_ffffffffffffe7a0,in_stack_ffffffffffffe798);
  local_1378 = (pointer)0x0;
  pRStack_1370 = (pointer)0x0;
  local_1368 = (pointer)0x0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector(pvVar3);
  paVar2 = (allocator<RPCResult> *)((ulong)pvVar3 & 0xffffffff00000000);
  RPCResult::RPCResult
            ((RPCResult *)CONCAT44(in_stack_ffffffffffffe7dc,in_stack_ffffffffffffe7d8),
             in_stack_ffffffffffffe7d4,in_stack_ffffffffffffe7c8,
             SUB41(in_stack_ffffffffffffe7c4 >> 0x18,0),
             (string *)CONCAT17(in_stack_ffffffffffffe7bf,in_stack_ffffffffffffe7b8),
             (vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe7b0,
             (bool)in_stack_ffffffffffffe7af);
  std::allocator<RPCResult>::allocator(paVar2);
  __l_05._M_len._0_7_ = in_stack_ffffffffffffe7a8;
  __l_05._M_array = (iterator)in_stack_ffffffffffffe7a0;
  __l_05._M_len._7_1_ = in_stack_ffffffffffffe7af;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe798,__l_05,
             (allocator_type *)in_stack_ffffffffffffe790);
  RPCResult::RPCResult
            (in_stack_ffffffffffffe7e0,in_stack_ffffffffffffe7dc,
             (string *)CONCAT44(in_stack_ffffffffffffe7d4,in_stack_ffffffffffffe7d0),
             in_stack_ffffffffffffe7c8,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffe7c4,in_stack_ffffffffffffe7c0),
             (bool)in_stack_ffffffffffffe7bf);
  RPCResults::RPCResults
            ((RPCResults *)CONCAT44(in_stack_ffffffffffffe7dc,in_stack_ffffffffffffe7d8),
             (RPCResult *)CONCAT44(in_stack_ffffffffffffe7d4,in_stack_ffffffffffffe7d0));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe7af,in_stack_ffffffffffffe7a8),
             (char *)in_stack_ffffffffffffe7a0,in_stack_ffffffffffffe798);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe7af,in_stack_ffffffffffffe7a8),
             (char *)in_stack_ffffffffffffe7a0,in_stack_ffffffffffffe798);
  HelpExampleCli(in_stack_ffffffffffffe790,in_stack_ffffffffffffe788);
  RPCExamples::RPCExamples((RPCExamples *)paVar2,(string *)0x6acf8b);
  this = (RPCArg *)local_13a0;
  std::function<UniValue(RPCHelpMan_const&,JSONRPCRequest_const&)>::
  function<analyzepsbt()::__0,void>(in_stack_ffffffffffffe768,in_stack_ffffffffffffe760);
  RPCHelpMan::RPCHelpMan
            (in_stack_ffffffffffffe8c8,in_stack_ffffffffffffe8c0,in_stack_ffffffffffffe8b8,
             in_stack_ffffffffffffe8b0,in_stack_ffffffffffffe8a8,in_stack_ffffffffffffe8a0,fun);
  std::function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)>::~function
            ((function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)> *)this);
  RPCExamples::~RPCExamples((RPCExamples *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator((allocator<char> *)(local_13a0 + 0x25));
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_137a);
  RPCResults::~RPCResults((RPCResults *)this);
  RPCResult::~RPCResult((RPCResult *)this);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe768);
  std::allocator<RPCResult>::~allocator((allocator<RPCResult> *)this);
  local_16d8 = local_300;
  do {
    local_16d8 = local_16d8 + -0x88;
    RPCResult::~RPCResult((RPCResult *)this);
  } while (local_16d8 != local_630);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe768);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_135a);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_1359);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe768);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_133a);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_1339);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe768);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_131a);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_1319);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe768);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator((allocator<char> *)local_12f9);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe768);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator((allocator<char> *)(local_12f9 + 0x1d));
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_12db);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe768);
  std::allocator<RPCResult>::~allocator((allocator<RPCResult> *)this);
  local_16f0 = local_670;
  do {
    local_16f0 = local_16f0 + -0x88;
    RPCResult::~RPCResult((RPCResult *)this);
  } while (local_16f0 != local_6f8);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe768);
  std::allocator<RPCResult>::~allocator((allocator<RPCResult> *)this);
  local_1708 = local_738;
  do {
    local_1708 = local_1708 + -0x88;
    RPCResult::~RPCResult((RPCResult *)this);
  } while (local_1708 != local_958);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe768);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator((allocator<char> *)(local_12c8 + 0xd));
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_12ba);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe768);
  std::allocator<RPCResult>::~allocator((allocator<RPCResult> *)this);
  local_1720 = local_a18;
  do {
    local_1720 = local_1720 + -0x88;
    RPCResult::~RPCResult((RPCResult *)this);
  } while (local_1720 != local_c38);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe768);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_129a);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_1299);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe768);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_127b);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_127a);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe768);
  std::allocator<RPCResult>::~allocator((allocator<RPCResult> *)this);
  puVar5 = local_e08;
  puVar1 = local_d80;
  do {
    puVar1 = puVar1 + -0x88;
    RPCResult::~RPCResult((RPCResult *)this);
  } while (puVar1 != puVar5);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe768);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_125a);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_1259);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_123b);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_123a);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe768);
  std::allocator<RPCResult>::~allocator((allocator<RPCResult> *)this);
  puVar5 = local_d00;
  puVar1 = local_c78;
  do {
    puVar1 = puVar1 + -0x88;
    RPCResult::~RPCResult((RPCResult *)this);
  } while (puVar1 != puVar5);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe768);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_121a);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_1219);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_11fa);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_11f9);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_11da);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_11d9);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe768);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_11ba);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_11b9);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe768);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_1192);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_1191);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_1172);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_1171);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_1152);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_1151);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_1132);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_1131);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_ffffffffffffe768);
  std::allocator<RPCArg>::~allocator((allocator<RPCArg> *)this);
  local_1768 = local_48;
  do {
    local_1768 = local_1768 + -0x108;
    RPCArg::~RPCArg(this);
  } while (local_1768 != local_150);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_1111);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_1109);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_10ea);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_10e9);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

static RPCHelpMan analyzepsbt()
{
    return RPCHelpMan{"analyzepsbt",
            "\nAnalyzes and provides information about the current status of a PSBT and its inputs\n",
            {
                {"psbt", RPCArg::Type::STR, RPCArg::Optional::NO, "A base64 string of a PSBT"}
            },
            RPCResult {
                RPCResult::Type::OBJ, "", "",
                {
                    {RPCResult::Type::ARR, "inputs", /*optional=*/true, "",
                    {
                        {RPCResult::Type::OBJ, "", "",
                        {
                            {RPCResult::Type::BOOL, "has_utxo", "Whether a UTXO is provided"},
                            {RPCResult::Type::BOOL, "is_final", "Whether the input is finalized"},
                            {RPCResult::Type::OBJ, "missing", /*optional=*/true, "Things that are missing that are required to complete this input",
                            {
                                {RPCResult::Type::ARR, "pubkeys", /*optional=*/true, "",
                                {
                                    {RPCResult::Type::STR_HEX, "keyid", "Public key ID, hash160 of the public key, of a public key whose BIP 32 derivation path is missing"},
                                }},
                                {RPCResult::Type::ARR, "signatures", /*optional=*/true, "",
                                {
                                    {RPCResult::Type::STR_HEX, "keyid", "Public key ID, hash160 of the public key, of a public key whose signature is missing"},
                                }},
                                {RPCResult::Type::STR_HEX, "redeemscript", /*optional=*/true, "Hash160 of the redeem script that is missing"},
                                {RPCResult::Type::STR_HEX, "witnessscript", /*optional=*/true, "SHA256 of the witness script that is missing"},
                            }},
                            {RPCResult::Type::STR, "next", /*optional=*/true, "Role of the next person that this input needs to go to"},
                        }},
                    }},
                    {RPCResult::Type::NUM, "estimated_vsize", /*optional=*/true, "Estimated vsize of the final signed transaction"},
                    {RPCResult::Type::STR_AMOUNT, "estimated_feerate", /*optional=*/true, "Estimated feerate of the final signed transaction in " + CURRENCY_UNIT + "/kvB. Shown only if all UTXO slots in the PSBT have been filled"},
                    {RPCResult::Type::STR_AMOUNT, "fee", /*optional=*/true, "The transaction fee paid. Shown only if all UTXO slots in the PSBT have been filled"},
                    {RPCResult::Type::STR, "next", "Role of the next person that this psbt needs to go to"},
                    {RPCResult::Type::STR, "error", /*optional=*/true, "Error message (if there is one)"},
                }
            },
            RPCExamples {
                HelpExampleCli("analyzepsbt", "\"psbt\"")
            },
        [&](const RPCHelpMan& self, const JSONRPCRequest& request) -> UniValue
{
    // Unserialize the transaction
    PartiallySignedTransaction psbtx;
    std::string error;
    if (!DecodeBase64PSBT(psbtx, request.params[0].get_str(), error)) {
        throw JSONRPCError(RPC_DESERIALIZATION_ERROR, strprintf("TX decode failed %s", error));
    }

    PSBTAnalysis psbta = AnalyzePSBT(psbtx);

    UniValue result(UniValue::VOBJ);
    UniValue inputs_result(UniValue::VARR);
    for (const auto& input : psbta.inputs) {
        UniValue input_univ(UniValue::VOBJ);
        UniValue missing(UniValue::VOBJ);

        input_univ.pushKV("has_utxo", input.has_utxo);
        input_univ.pushKV("is_final", input.is_final);
        input_univ.pushKV("next", PSBTRoleName(input.next));

        if (!input.missing_pubkeys.empty()) {
            UniValue missing_pubkeys_univ(UniValue::VARR);
            for (const CKeyID& pubkey : input.missing_pubkeys) {
                missing_pubkeys_univ.push_back(HexStr(pubkey));
            }
            missing.pushKV("pubkeys", std::move(missing_pubkeys_univ));
        }
        if (!input.missing_redeem_script.IsNull()) {
            missing.pushKV("redeemscript", HexStr(input.missing_redeem_script));
        }
        if (!input.missing_witness_script.IsNull()) {
            missing.pushKV("witnessscript", HexStr(input.missing_witness_script));
        }
        if (!input.missing_sigs.empty()) {
            UniValue missing_sigs_univ(UniValue::VARR);
            for (const CKeyID& pubkey : input.missing_sigs) {
                missing_sigs_univ.push_back(HexStr(pubkey));
            }
            missing.pushKV("signatures", std::move(missing_sigs_univ));
        }
        if (!missing.getKeys().empty()) {
            input_univ.pushKV("missing", std::move(missing));
        }
        inputs_result.push_back(std::move(input_univ));
    }
    if (!inputs_result.empty()) result.pushKV("inputs", std::move(inputs_result));

    if (psbta.estimated_vsize != std::nullopt) {
        result.pushKV("estimated_vsize", (int)*psbta.estimated_vsize);
    }
    if (psbta.estimated_feerate != std::nullopt) {
        result.pushKV("estimated_feerate", ValueFromAmount(psbta.estimated_feerate->GetFeePerK()));
    }
    if (psbta.fee != std::nullopt) {
        result.pushKV("fee", ValueFromAmount(*psbta.fee));
    }
    result.pushKV("next", PSBTRoleName(psbta.next));
    if (!psbta.error.empty()) {
        result.pushKV("error", psbta.error);
    }

    return result;
},
    };
}